

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

bool __thiscall State::AddDefault(State *this,StringPiece path,string *err)

{
  Node *pNVar1;
  Node *node;
  Node *local_90;
  StringPiece local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_88.len_ = path.len_;
  local_88.str_ = path.str_;
  pNVar1 = LookupNode(this,path);
  local_90 = pNVar1;
  if (pNVar1 == (Node *)0x0) {
    StringPiece::AsString_abi_cxx11_(&local_58,&local_88);
    std::operator+(&local_78,"unknown target \'",&local_58);
    std::operator+(&local_38,&local_78,"\'");
    std::__cxx11::string::operator=((string *)err,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->defaults_,&local_90);
  }
  return pNVar1 != (Node *)0x0;
}

Assistant:

bool State::AddDefault(StringPiece path, string* err) {
  Node* node = LookupNode(path);
  if (!node) {
    *err = "unknown target '" + path.AsString() + "'";
    return false;
  }
  defaults_.push_back(node);
  return true;
}